

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_InsertValue_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_InsertValue_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  value_type vVar2;
  char *expected_predicate_value;
  char *actual_predicate_value;
  char *expression_text;
  AssertionResult *assertion_result;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  char *pcVar3;
  reference piVar4;
  bool *lhs;
  long in_RDI;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_3;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  insert_it;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  int index;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb00;
  bool *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  int iVar5;
  char *in_stack_fffffffffffffb18;
  int line;
  char *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb28;
  Type type;
  AssertHelper *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffb70;
  AssertionResult *in_stack_fffffffffffffb78;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb80;
  string local_460 [55];
  undefined1 local_429;
  AssertionResult local_428 [2];
  undefined1 local_401;
  AssertionResult local_400;
  value_type local_3ec;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_3e8;
  string local_3c0 [55];
  undefined1 local_389;
  AssertionResult local_388 [2];
  undefined1 local_361;
  AssertionResult local_360;
  value_type local_34c;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_348;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_320;
  key_type local_2e4;
  size_type local_2e0;
  undefined4 local_2d4;
  AssertionResult local_2d0 [2];
  key_type local_2ac;
  size_type local_2a8;
  undefined4 local_29c;
  AssertionResult local_298 [2];
  size_type local_278;
  undefined4 local_26c;
  AssertionResult local_268 [3];
  value_type local_22c;
  value_type local_1fc;
  value_type local_1cc;
  value_type local_19c;
  value_type local_16c;
  value_type local_13c;
  value_type local_10c;
  value_type local_dc;
  string local_d8 [55];
  byte local_a1;
  AssertionResult local_a0 [3];
  value_type local_64;
  string local_60 [71];
  undefined1 local_19;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  local_19 = google::
             BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe191e8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb00,
             (bool *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),(type *)0xe1920a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               in_stack_fffffffffffffb60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb30,type,in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb80,(Message *)in_stack_fffffffffffffb78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0xe192cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe19362);
  local_64 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xe193b8);
  local_a1 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb00,
             (bool *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),(type *)0xe193dc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               in_stack_fffffffffffffb60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb30,type,in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffb80,(Message *)in_stack_fffffffffffffb78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0xe194af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe19546);
  local_dc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
  local_10c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
  expected_predicate_value = (char *)(in_RDI + 0x10);
  local_13c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
  actual_predicate_value = (char *)(in_RDI + 0x10);
  local_16c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
  expression_text = (char *)(in_RDI + 0x10);
  local_19c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb80,(value_type *)in_stack_fffffffffffffb78);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  local_1cc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffb80,(value_type *)assertion_result);
  this_00 = (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_1fc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  local_22c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  local_26c = 9;
  local_278 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xe1976c);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb18,
             (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             (uint *)in_stack_fffffffffffffb08,(unsigned_long *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb30);
    testing::AssertionResult::failure_message((AssertionResult *)0xe197e5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb30,type,in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    testing::Message::~Message((Message *)0xe19842);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe198b3);
  local_29c = 1;
  local_2ac = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  local_2a8 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb00,
                      (key_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb18,
             (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             (uint *)in_stack_fffffffffffffb08,(unsigned_long *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb30);
    testing::AssertionResult::failure_message((AssertionResult *)0xe1996e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb30,type,in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    testing::Message::~Message((Message *)0xe199cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe19a3c);
  local_2d4 = 1;
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_2e4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  local_2e0 = google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb00,
                      (key_type *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffb18,
             (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             (uint *)in_stack_fffffffffffffb08,(unsigned_long *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0xe19af7);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    testing::Message::~Message((Message *)0xe19b54);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe19bc5);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)in_stack_fffffffffffffb00);
  pcVar3 = (char *)(in_RDI + 0x10);
  local_34c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=(&local_320,&local_348);
  local_361 = 0;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffffb18,
             (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             in_stack_fffffffffffffb08,(bool *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffb18 =
         testing::AssertionResult::failure_message((AssertionResult *)0xe19ca3);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    testing::Message::~Message((Message *)0xe19d00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe19d6e);
  piVar4 = google::
           dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_320);
  iVar5 = *piVar4;
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  local_389 = iVar5 == vVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb00,
             (bool *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),(type *)0xe19dc0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20),
               (char *)CONCAT44(iVar5,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    std::__cxx11::string::~string(local_3c0);
    testing::Message::~Message((Message *)0xe19e93);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe19f2a);
  lhs = (bool *)(in_RDI + 0x10);
  local_3ec = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_00,(value_type *)assertion_result);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  ::operator=(&local_320,&local_3e8);
  local_401 = 1;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            (in_stack_fffffffffffffb18,(char *)CONCAT44(iVar5,in_stack_fffffffffffffb10),lhs,
             (bool *)in_stack_fffffffffffffb00);
  line = (int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffb00 =
         (HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xe19ffb);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,line,(char *)CONCAT44(iVar5,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    testing::Message::~Message((Message *)0xe1a058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe1a0c6);
  piVar4 = google::
           dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_320);
  index = *piVar4;
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffffb00,index);
  local_429 = index == vVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb00,
             (bool *)CONCAT44(index,in_stack_fffffffffffffaf8),(type *)0xe1a118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_428);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,pcVar3,line,(char *)CONCAT44(iVar5,in_stack_fffffffffffffb10));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb00);
    std::__cxx11::string::~string(local_460);
    testing::Message::~Message((Message *)0xe1a1eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xe1a279);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, InsertValue) {
  // First, try some straightforward insertions.
  EXPECT_TRUE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1111)));

  // Check the return type.
  pair<typename TypeParam::iterator, bool> insert_it;
  insert_it = this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(false, insert_it.second);  // false: already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(1));

  insert_it = this->ht_.insert(this->UniqueObject(2));
  EXPECT_EQ(true, insert_it.second);  // true: not already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(2));
}